

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AddVisibilityPresetFlags
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *lang)

{
  cmake *this_00;
  cmGeneratorTarget *pcVar1;
  bool bVar2;
  TargetType TVar3;
  PolicyStatus PVar4;
  int iVar5;
  char *pcVar6;
  char *__s1;
  string *psVar7;
  ostream *poVar8;
  string *psVar9;
  cmLocalGenerator *pcVar10;
  PolicyID id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  pair<std::_Rb_tree_iterator<const_cmGeneratorTarget_*>,_bool> pVar11;
  cmGeneratorTarget *target_local;
  allocator<char> local_231;
  string compileOption;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string flagDefine;
  string warnCMP0063;
  string option;
  
  if (lang->_M_string_length == 0) {
    return;
  }
  warnCMP0063._M_dataplus._M_p = (pointer)&warnCMP0063.field_2;
  warnCMP0063._M_string_length = 0;
  warnCMP0063.field_2._M_local_buf[0] = '\0';
  target_local = target;
  TVar3 = cmGeneratorTarget::GetType(target);
  if (((TVar3 == SHARED_LIBRARY) ||
      (TVar3 = cmGeneratorTarget::GetType(target_local), TVar3 == MODULE_LIBRARY)) ||
     (bVar2 = cmGeneratorTarget::IsExecutableWithExports(target_local), bVar2)) {
LAB_00190179:
    psVar9 = (string *)0x0;
  }
  else {
    PVar4 = cmGeneratorTarget::GetPolicyStatusCMP0063(target_local);
    if (PVar4 == OLD) goto LAB_00190601;
    if (PVar4 != WARN) goto LAB_00190179;
    psVar9 = &warnCMP0063;
  }
  pcVar1 = target_local;
  std::operator+(&option,"CMAKE_",lang);
  std::operator+(&compileOption,&option,"_COMPILE_OPTIONS_VISIBILITY");
  std::__cxx11::string::~string((string *)&option);
  pcVar6 = cmMakefile::GetDefinition(this->Makefile,&compileOption);
  if (pcVar6 != (char *)0x0) {
    std::operator+(&flagDefine,lang,"_VISIBILITY_PRESET");
    __s1 = cmGeneratorTarget::GetProperty(pcVar1,&flagDefine);
    if (__s1 != (char *)0x0) {
      if (psVar9 == (string *)0x0) {
        iVar5 = strcmp(__s1,"hidden");
        if (((iVar5 != 0) && (iVar5 = strcmp(__s1,"default"), iVar5 != 0)) &&
           ((iVar5 = strcmp(__s1,"protected"), iVar5 != 0 &&
            (iVar5 = strcmp(__s1,"internal"), iVar5 != 0)))) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&option);
          poVar8 = std::operator<<((ostream *)&option,"Target ");
          psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar1);
          poVar8 = std::operator<<(poVar8,(string *)psVar7);
          poVar8 = std::operator<<(poVar8," uses unsupported value \"");
          poVar8 = std::operator<<(poVar8,__s1);
          poVar8 = std::operator<<(poVar8,"\" for ");
          poVar8 = std::operator<<(poVar8,(string *)&flagDefine);
          poVar8 = std::operator<<(poVar8,".");
          std::operator<<(poVar8,
                          " The supported values are: default, hidden, protected, and internal.");
          std::__cxx11::stringbuf::str();
          cmSystemTools::Error(&local_208);
          std::__cxx11::string::~string((string *)&local_208);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&option);
          goto LAB_001903d0;
        }
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,pcVar6,&local_231);
        std::operator+(&option,&local_208,__s1);
        std::__cxx11::string::~string((string *)&local_208);
        (*this->_vptr_cmLocalGenerator[6])(this,flags,&option);
        this_01 = &option;
      }
      else {
        std::operator+(&local_208,"  ",&flagDefine);
        std::operator+(&option,&local_208,"\n");
        std::__cxx11::string::append((string *)psVar9);
        std::__cxx11::string::~string((string *)&option);
        this_01 = &local_208;
      }
      std::__cxx11::string::~string((string *)this_01);
    }
LAB_001903d0:
    std::__cxx11::string::~string((string *)&flagDefine);
  }
  std::__cxx11::string::~string((string *)&compileOption);
  bVar2 = std::operator==(lang,"CXX");
  pcVar1 = target_local;
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&option,"CMAKE_CXX_COMPILE_OPTIONS_VISIBILITY_INLINES_HIDDEN",
               (allocator<char> *)&compileOption);
    pcVar6 = cmMakefile::GetDefinition(this->Makefile,&option);
    if (pcVar6 != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&compileOption,"VISIBILITY_INLINES_HIDDEN",(allocator<char> *)&flagDefine
                );
      bVar2 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,&compileOption);
      std::__cxx11::string::~string((string *)&compileOption);
      if (bVar2) {
        if (psVar9 == (string *)0x0) {
          (*this->_vptr_cmLocalGenerator[7])(this,flags,pcVar6);
        }
        else {
          std::__cxx11::string::append((char *)psVar9);
        }
      }
    }
    std::__cxx11::string::~string((string *)&option);
  }
  if ((warnCMP0063._M_string_length != 0) &&
     (pVar11 = std::
               _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
               ::_M_insert_unique<cmGeneratorTarget_const*const&>
                         ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                           *)&this->WarnCMP0063,&target_local),
     ((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&option);
    cmPolicies::GetPolicyWarning_abi_cxx11_(&compileOption,(cmPolicies *)0x3f,id);
    poVar8 = std::operator<<((ostream *)&option,(string *)&compileOption);
    poVar8 = std::operator<<(poVar8,"\nTarget \"");
    psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(target_local);
    poVar8 = std::operator<<(poVar8,(string *)psVar9);
    poVar8 = std::operator<<(poVar8,"\" of type \"");
    TVar3 = cmGeneratorTarget::GetType(target_local);
    pcVar6 = cmState::GetTargetTypeName(TVar3);
    poVar8 = std::operator<<(poVar8,pcVar6);
    poVar8 = std::operator<<(poVar8,"\" has the following visibility properties set for ");
    poVar8 = std::operator<<(poVar8,(string *)lang);
    poVar8 = std::operator<<(poVar8,":\n");
    poVar8 = std::operator<<(poVar8,(string *)&warnCMP0063);
    std::operator<<(poVar8,"For compatibility CMake is not honoring them for this target.");
    std::__cxx11::string::~string((string *)&compileOption);
    pcVar10 = cmGeneratorTarget::GetLocalGenerator(target_local);
    this_00 = pcVar10->GlobalGenerator->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)&flagDefine);
    cmake::IssueMessage(this_00,AUTHOR_WARNING,&compileOption,(cmListFileBacktrace *)&flagDefine);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&flagDefine._M_string_length);
    std::__cxx11::string::~string((string *)&compileOption);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&option);
  }
LAB_00190601:
  std::__cxx11::string::~string((string *)&warnCMP0063);
  return;
}

Assistant:

void cmLocalGenerator::AddVisibilityPresetFlags(
  std::string& flags, cmGeneratorTarget const* target, const std::string& lang)
{
  if (lang.empty()) {
    return;
  }

  std::string warnCMP0063;
  std::string* pWarnCMP0063 = nullptr;
  if (target->GetType() != cmStateEnums::SHARED_LIBRARY &&
      target->GetType() != cmStateEnums::MODULE_LIBRARY &&
      !target->IsExecutableWithExports()) {
    switch (target->GetPolicyStatusCMP0063()) {
      case cmPolicies::OLD:
        return;
      case cmPolicies::WARN:
        pWarnCMP0063 = &warnCMP0063;
        break;
      default:
        break;
    }
  }

  AddVisibilityCompileOption(flags, target, this, lang, pWarnCMP0063);

  if (lang == "CXX") {
    AddInlineVisibilityCompileOption(flags, target, this, pWarnCMP0063);
  }

  if (!warnCMP0063.empty() && this->WarnCMP0063.insert(target).second) {
    std::ostringstream w;
    /* clang-format off */
    w <<
      cmPolicies::GetPolicyWarning(cmPolicies::CMP0063) << "\n"
      "Target \"" << target->GetName() << "\" of "
      "type \"" << cmState::GetTargetTypeName(target->GetType()) << "\" "
      "has the following visibility properties set for " << lang << ":\n" <<
      warnCMP0063 <<
      "For compatibility CMake is not honoring them for this target.";
    /* clang-format on */
    target->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
      MessageType::AUTHOR_WARNING, w.str(), target->GetBacktrace());
  }
}